

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BigNumber.cpp
# Opt level: O0

void __thiscall BigNumber::m_format(BigNumber *this)

{
  bool bVar1;
  reference pvVar2;
  size_type sVar3;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_40;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_38;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_30;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_28;
  const_iterator local_20;
  uint local_18;
  uint local_14;
  uint m_size;
  int i;
  BigNumber *this_local;
  
  local_14 = 0;
  _m_size = this;
  local_18 = Polynome::m_degre(&this->super_Polynome);
  while( true ) {
    bVar1 = false;
    if (local_14 < local_18) {
      pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this,
                          (ulong)((local_18 - 1) - local_14));
      bVar1 = false;
      if (*pvVar2 == 0) {
        sVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this);
        bVar1 = 1 < sVar3;
      }
    }
    if (!bVar1) break;
    local_40._M_current =
         (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this);
    local_38 = __gnu_cxx::
               __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
               ::operator+(&local_40,(ulong)local_18);
    local_30 = __gnu_cxx::
               __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
               ::operator-(&local_38,1);
    local_28 = __gnu_cxx::
               __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
               ::operator-(&local_30,(long)(int)local_14);
    __gnu_cxx::
    __normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>::
    __normal_iterator<unsigned_int*>
              ((__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>
                *)&local_20,&local_28);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::erase
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this,local_20);
    local_14 = local_14 + 1;
  }
  return;
}

Assistant:

void BigNumber::m_format(){
    int i = 0;
    unsigned int m_size = m_degre();
    while((i < m_size) && (m_coef[m_size-1-i] == 0) && m_coef.size() > 1){
        m_coef.erase(m_coef.begin() + m_size-1-i);
        i++;
    }
}